

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

void siphash13_test(void *input,int len,uint32_t seed,void *out)

{
  uint64_t uVar1;
  uchar key [16];
  ulong local_18 [2];
  
  local_18[1] = 0;
  if (len == 0) {
    *(undefined4 *)out = 0;
  }
  else {
    local_18[0] = (ulong)seed;
    uVar1 = siphash13((uchar *)local_18,(uchar *)input,(long)len);
    *(uint64_t *)out = uVar1;
  }
  return;
}

Assistant:

void
siphash13_test(const void *input, int len, uint32_t seed, void *out)
{
  unsigned char	key[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};
  if (!len) {
    *(uint32_t *) out = 0;
    return;
  }
  memcpy(key, &seed, sizeof(seed));
  // objsize: 0x450-0x75a: 778
  *(uint64_t *) out = siphash13(key, (const unsigned char *)input, (size_t) len);
}